

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * duckdb_fmt::v6::internal::
       parse_precision<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  byte bVar1;
  type tVar2;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *this;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  aVar7;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  aVar8;
  uint uVar9;
  size_type __dnew;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_98;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *local_90;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *local_88 [2];
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *local_78;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_70 [2];
  undefined1 local_60 [16];
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_50;
  undefined1 local_40 [16];
  
  pbVar6 = (byte *)(begin + 1);
  if (pbVar6 == (byte *)end) {
LAB_002a3809:
    aVar8.values_ =
         (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_60;
    local_70[0].values_ = aVar8.values_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"missing precision specifier","");
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_error(&handler->
                super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               ,(string *)local_70);
    aVar7 = local_70[0];
  }
  else {
    bVar1 = *pbVar6;
    uVar3 = (uint)(char)bVar1;
    if (uVar3 - 0x30 < 10) {
      pbVar4 = (byte *)(begin + 2);
      uVar9 = 0;
      pbVar6 = pbVar4;
      if (bVar1 != 0x30) {
        do {
          pbVar5 = pbVar6;
          if (0xccccccc < uVar9) {
            pbVar4 = pbVar5 + -1;
            uVar9 = 0x80000000;
            goto LAB_002a3892;
          }
          uVar9 = ((int)(char)uVar3 + uVar9 * 10) - 0x30;
          pbVar4 = (byte *)end;
          if (pbVar5 == (byte *)end) break;
          uVar3 = (uint)*pbVar5;
          pbVar6 = pbVar5 + 1;
          pbVar4 = pbVar5;
        } while ((byte)(*pbVar5 - 0x30) < 10);
        if ((int)uVar9 < 0) {
LAB_002a3892:
          local_78 = (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                      *)0x11;
          local_98.values_ =
               (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                *)local_88;
          local_98.values_ =
               (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                *)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_78);
          local_88[0] = local_78;
          ((local_98.args_)->value_).field_0.long_long_value = 0x69207265626d756e;
          (&((local_98.args_)->value_).field_0.long_long_value)[1] = 0x6962206f6f742073;
          *(undefined1 *)&local_98.values_[1].field_0 = 0x67;
          local_90 = local_78;
          *(undefined1 *)
           ((long)&((local_98.args_)->value_).field_0 + (long)&(local_78->out_).container) = 0;
          specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                     ,(string *)&local_98);
          if (local_98.values_ !=
              (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               *)local_88) {
            operator_delete(local_98.values_);
          }
        }
      }
      ((handler->
       super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
       ).super_specs_setter<char>.specs_)->precision = uVar9;
LAB_002a38fe:
      tVar2 = (handler->checker_).arg_type_;
      if (tVar2 != pointer_type && 8 < tVar2 - named_arg_type) {
        return (char *)pbVar4;
      }
      this = (handler->checker_).error_handler_;
      local_78 = (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                  *)0x2c;
      local_98.values_ =
           (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)local_88;
      local_98.values_ =
           (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_78);
      local_88[0] = local_78;
      ((specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        *)&(local_98.args_)->value_)->super_specs_setter<char> =
           (specs_setter<char>)0x6f69736963657270;
      ((specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        *)&(local_98.args_)->value_)->parse_context_ =
           (basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *)
           0x6c6120746f6e206e;
      *(undefined8 *)(local_98.values_ + 1) = 0x6f66206465776f6c;
      *(undefined8 *)((long)(local_98.values_ + 1) + 8) = 0x6120736968742072;
      *(undefined8 *)((long)(local_98.values_ + 1) + 0xc) = 0x6d75677261207369;
      *(undefined8 *)((long)(local_98.values_ + 2) + 4) = 0x6570797420746e65;
      local_90 = local_78;
      *(undefined1 *)
       ((long)&((specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 *)&(local_98.args_)->value_)->super_specs_setter<char> +
       (long)&(local_78->out_).container) = 0;
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(this,(string *)&local_98);
      aVar7 = local_98;
      pbVar6 = pbVar4;
      if (local_98.values_ ==
          (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
           *)local_88) {
        return (char *)pbVar4;
      }
      goto LAB_002a3986;
    }
    if (bVar1 != 0x7b) goto LAB_002a3809;
    pbVar6 = (byte *)(begin + 2);
    if (pbVar6 != (byte *)end) {
      local_98 = (anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
                  )handler;
      pbVar6 = (byte *)parse_arg_id<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>>
                                 ((char *)pbVar6,end,
                                  (precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                                   *)&local_98);
    }
    if ((pbVar6 != (byte *)end) &&
       (pbVar4 = pbVar6 + 1, bVar1 = *pbVar6, pbVar6 = pbVar4, bVar1 == 0x7d)) goto LAB_002a38fe;
    aVar8.values_ =
         (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          *)(local_60 + 0x20);
    local_50.values_ = aVar8.values_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_60 + 0x10),"invalid format string","");
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_error(&handler->
                super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               ,(string *)(local_60 + 0x10));
    aVar7 = local_50;
  }
  if (aVar7.values_ == aVar8.values_) {
    return (char *)pbVar6;
  }
LAB_002a3986:
  operator_delete(aVar7.values_);
  return (char *)pbVar6;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}